

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Minefield_Data_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Minefield_Data_PDU::SetMines
          (Minefield_Data_PDU *this,
          vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_> *M)

{
  bool bVar1;
  KBOOL KVar2;
  KUINT16 KVar3;
  KException *this_00;
  size_type sVar4;
  pointer pMVar5;
  __normal_iterator<KDIS::DATA_TYPE::Mine_*,_std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>_>
  local_80;
  Mine *local_78;
  __normal_iterator<KDIS::DATA_TYPE::Mine_*,_std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>_>
  local_70;
  Mine *local_68;
  undefined1 local_5d;
  allocator<char> local_49;
  KString local_48;
  __normal_iterator<const_KDIS::DATA_TYPE::Mine_*,_std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>_>
  local_28;
  const_iterator citrEnd;
  const_iterator citr;
  vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_> *M_local;
  Minefield_Data_PDU *this_local;
  
  citrEnd = std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>::begin(M);
  local_28._M_current =
       (Mine *)std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>::end(M);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&citrEnd,&local_28);
    if (!bVar1) {
      std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>::operator=
                (&this->m_vMines,M);
      sVar4 = std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>::size(M);
      this->m_ui8NumMines = (KUINT8)sVar4;
      (this->super_Minefield_Header).super_Header.super_Header6.m_ui16PDULength =
           (ushort)this->m_ui8NumSensTyp * 2 + 0x2c;
      local_70._M_current =
           (Mine *)std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>::begin
                             (&this->m_vMines);
      __gnu_cxx::
      __normal_iterator<KDIS::DATA_TYPE::Mine_const*,std::vector<KDIS::DATA_TYPE::Mine,std::allocator<KDIS::DATA_TYPE::Mine>>>
      ::__normal_iterator<KDIS::DATA_TYPE::Mine*>
                ((__normal_iterator<KDIS::DATA_TYPE::Mine_const*,std::vector<KDIS::DATA_TYPE::Mine,std::allocator<KDIS::DATA_TYPE::Mine>>>
                  *)&local_68,&local_70);
      citrEnd._M_current = local_68;
      local_80._M_current =
           (Mine *)std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>::end
                             (&this->m_vMines);
      __gnu_cxx::
      __normal_iterator<KDIS::DATA_TYPE::Mine_const*,std::vector<KDIS::DATA_TYPE::Mine,std::allocator<KDIS::DATA_TYPE::Mine>>>
      ::__normal_iterator<KDIS::DATA_TYPE::Mine*>
                ((__normal_iterator<KDIS::DATA_TYPE::Mine_const*,std::vector<KDIS::DATA_TYPE::Mine,std::allocator<KDIS::DATA_TYPE::Mine>>>
                  *)&local_78,&local_80);
      local_28._M_current = local_78;
      while( true ) {
        bVar1 = __gnu_cxx::operator!=(&citrEnd,&local_28);
        if (!bVar1) break;
        pMVar5 = __gnu_cxx::
                 __normal_iterator<const_KDIS::DATA_TYPE::Mine_*,_std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>_>
                 ::operator->(&citrEnd);
        KVar3 = DATA_TYPE::Mine::GetLength(pMVar5);
        (this->super_Minefield_Header).super_Header.super_Header6.m_ui16PDULength =
             (this->super_Minefield_Header).super_Header.super_Header6.m_ui16PDULength + KVar3;
        __gnu_cxx::
        __normal_iterator<const_KDIS::DATA_TYPE::Mine_*,_std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>_>
        ::operator++(&citrEnd);
      }
      return;
    }
    pMVar5 = __gnu_cxx::
             __normal_iterator<const_KDIS::DATA_TYPE::Mine_*,_std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>_>
             ::operator->(&citrEnd);
    KVar2 = DATA_TYPE::MinefieldDataFilter::operator!=
                      (&pMVar5->super_MinefieldDataFilter,&this->m_DataFilter);
    if (KVar2) break;
    __gnu_cxx::
    __normal_iterator<const_KDIS::DATA_TYPE::Mine_*,_std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>_>
    ::operator++(&citrEnd);
  }
  local_5d = 1;
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"SetMines",&local_49);
  KException::KException<char_const*>
            (this_00,&local_48,10,
             "One or more mines do not have the correct filters.\t\t\t\t                                                                They must have the same filter as the PDU MinefieldDataFilter.\t                                                                This set request has been ignored"
            );
  local_5d = 0;
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void Minefield_Data_PDU::SetMines(const std::vector<Mine> &M) noexcept(false)
{
    // First check the mines all have the same optional fields set as MinefieldDataFilter.
    vector<Mine>::const_iterator citr = M.begin();
    vector<Mine>::const_iterator citrEnd = M.end();
    for( ; citr != citrEnd; ++citr )
    {
        if( citr->MinefieldDataFilter::operator != ( m_DataFilter ) )
        {
            throw KException( __FUNCTION__, INVALID_OPERATION, "One or more mines do not have the correct filters.				\
                                                                They must have the same filter as the PDU MinefieldDataFilter.	\
                                                                This set request has been ignored" );
        }
    }

    m_vMines = M;
    m_ui8NumMines = M.size();

    // Calculate the new size
    m_ui16PDULength = MINEFIELD_DATA_PDU_SIZE + ( m_ui8NumSensTyp * 2 );
    citr = m_vMines.begin();
    citrEnd = m_vMines.end();
    for( ; citr != citrEnd; ++citr )
    {
        m_ui16PDULength += citr->GetLength();
    }
}